

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compress_generic
                 (ZSTD_CCtx *cctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  ZSTD_CCtx_params params_00;
  uint uVar1;
  size_t sVar2;
  int in_ECX;
  void *in_RDX;
  long in_RSI;
  long in_RDI;
  size_t errcod_1;
  size_t errcod;
  ZSTD_prefixDict prefixDict;
  ZSTD_CCtx_params params;
  size_t in_stack_fffffffffffffea0;
  U64 in_stack_fffffffffffffea8;
  ZSTD_CCtx_params *in_stack_fffffffffffffeb0;
  undefined4 local_d4;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 uStack_c0;
  ZSTD_dictContentType_e in_stack_ffffffffffffff44;
  undefined8 in_stack_ffffffffffffff50;
  ZSTD_EndDirective flushMode;
  void *dict;
  ZSTD_CStream *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  size_t local_8;
  
  flushMode = (ZSTD_EndDirective)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  if (*(ulong *)(in_RSI + 8) < *(ulong *)(in_RSI + 0x10)) {
    local_8 = 0xffffffffffffffff;
  }
  else if (*(ulong *)((long)in_RDX + 8) < *(ulong *)((long)in_RDX + 0x10)) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    if (*(int *)(in_RDI + 0x360) == 0) {
      memcpy(&stack0xffffffffffffff60,(void *)(in_RDI + 0x10),0x78);
      sVar2 = *(size_t *)(in_RDI + 0x378);
      dict = *(void **)(in_RDI + 0x380);
      in_stack_ffffffffffffff58 = *(ZSTD_CStream **)(in_RDI + 0x388);
      memset((void *)(in_RDI + 0x378),0,0x18);
      if (in_ECX == 2) {
        *(long *)(in_RDI + 0x120) = *(long *)((long)in_RDX + 8) + 1;
      }
      ZSTD_getCParamsFromCCtxParams
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      params_00.cParams.windowLog = in_stack_ffffffffffffff3c;
      params_00.format = in_stack_ffffffffffffff38;
      params_00.cParams.chainLog = uStack_c0;
      params_00.cParams.hashLog = in_stack_ffffffffffffff44;
      params_00.cParams.searchLog = (int)in_stack_ffffffffffffff80;
      params_00.cParams.searchLength = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
      params_00.cParams.targetLength = (int)in_stack_ffffffffffffff88;
      params_00.cParams.strategy = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
      params_00.fParams.contentSizeFlag = (int)in_stack_ffffffffffffff90;
      params_00.fParams.checksumFlag = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
      params_00.fParams.noDictIDFlag = (int)in_stack_ffffffffffffff98;
      params_00.compressionLevel = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      params_00.disableLiteralCompression = (int)in_stack_ffffffffffffffa0;
      params_00.forceWindow = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
      params_00.nbWorkers = (int)in_stack_ffffffffffffffa8;
      params_00.jobSize = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
      params_00.overlapSizeLog = (int)in_stack_ffffffffffffffb0;
      params_00.ldmParams.enableLdm = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
      params_00.ldmParams.hashLog = (int)in_stack_ffffffffffffffb8;
      params_00.ldmParams.bucketSizeLog = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
      params_00.ldmParams.minMatchLength = (int)in_stack_ffffffffffffffc0;
      params_00.ldmParams.hashEveryLog = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
      params_00._88_8_ = in_stack_ffffffffffffffc8;
      params_00.customMem.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffd0;
      params_00.customMem.customFree._0_4_ = in_stack_ffffffffffffffd8;
      params_00.customMem.customFree._4_4_ = in_ECX;
      params_00.customMem.opaque = in_RDX;
      sVar2 = ZSTD_resetCStream_internal
                        (in_stack_ffffffffffffff58,dict,sVar2,in_stack_ffffffffffffff44,
                         (ZSTD_CDict *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                         ,params_00,CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      flushMode = (ZSTD_EndDirective)((ulong)dict >> 0x20);
      uVar1 = ERR_isError(sVar2);
      in_stack_ffffffffffffff64 = local_d4;
      in_stack_ffffffffffffff68 = in_stack_ffffffffffffff30;
      in_stack_ffffffffffffff6c = in_stack_ffffffffffffff34;
      if (uVar1 != 0) {
        return sVar2;
      }
    }
    local_8 = ZSTD_compressStream_generic
                        ((ZSTD_CStream *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                         (ZSTD_outBuffer *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (ZSTD_inBuffer *)in_stack_ffffffffffffff58,flushMode);
    uVar1 = ERR_isError(local_8);
    if (uVar1 == 0) {
      local_8 = *(long *)(in_RDI + 0x350) - *(long *)(in_RDI + 0x358);
    }
  }
  return local_8;
}

Assistant:

size_t ZSTD_compress_generic (ZSTD_CCtx* cctx,
                              ZSTD_outBuffer* output,
                              ZSTD_inBuffer* input,
                              ZSTD_EndDirective endOp)
{
    DEBUGLOG(5, "ZSTD_compress_generic, endOp=%u ", (U32)endOp);
    /* check conditions */
    if (output->pos > output->size) return ERROR(GENERIC);
    if (input->pos  > input->size)  return ERROR(GENERIC);
    assert(cctx!=NULL);

    /* transparent initialization stage */
    if (cctx->streamStage == zcss_init) {
        ZSTD_CCtx_params params = cctx->requestedParams;
        ZSTD_prefixDict const prefixDict = cctx->prefixDict;
        memset(&cctx->prefixDict, 0, sizeof(cctx->prefixDict));  /* single usage */
        assert(prefixDict.dict==NULL || cctx->cdict==NULL);   /* only one can be set */
        DEBUGLOG(4, "ZSTD_compress_generic : transparent init stage");
        if (endOp == ZSTD_e_end) cctx->pledgedSrcSizePlusOne = input->size + 1;  /* auto-fix pledgedSrcSize */
        params.cParams = ZSTD_getCParamsFromCCtxParams(
                &cctx->requestedParams, cctx->pledgedSrcSizePlusOne-1, 0 /*dictSize*/);

#ifdef ZSTD_MULTITHREAD
        if ((cctx->pledgedSrcSizePlusOne-1) <= ZSTDMT_JOBSIZE_MIN) {
            params.nbWorkers = 0; /* do not invoke multi-threading when src size is too small */
        }
        if (params.nbWorkers > 0) {
            /* mt context creation */
            if (cctx->mtctx == NULL || (params.nbWorkers != ZSTDMT_getNbWorkers(cctx->mtctx))) {
                DEBUGLOG(4, "ZSTD_compress_generic: creating new mtctx for nbWorkers=%u",
                            params.nbWorkers);
                if (cctx->mtctx != NULL)
                    DEBUGLOG(4, "ZSTD_compress_generic: previous nbWorkers was %u",
                                ZSTDMT_getNbWorkers(cctx->mtctx));
                ZSTDMT_freeCCtx(cctx->mtctx);
                cctx->mtctx = ZSTDMT_createCCtx_advanced(params.nbWorkers, cctx->customMem);
                if (cctx->mtctx == NULL) return ERROR(memory_allocation);
            }
            /* mt compression */
            DEBUGLOG(4, "call ZSTDMT_initCStream_internal as nbWorkers=%u", params.nbWorkers);
            CHECK_F( ZSTDMT_initCStream_internal(
                        cctx->mtctx,
                        prefixDict.dict, prefixDict.dictSize, ZSTD_dct_rawContent,
                        cctx->cdict, params, cctx->pledgedSrcSizePlusOne-1) );
            cctx->streamStage = zcss_load;
            cctx->appliedParams.nbWorkers = params.nbWorkers;
        } else
#endif
        {   CHECK_F( ZSTD_resetCStream_internal(cctx,
                            prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType,
                            cctx->cdict,
                            params, cctx->pledgedSrcSizePlusOne-1) );
            assert(cctx->streamStage == zcss_load);
            assert(cctx->appliedParams.nbWorkers == 0);
    }   }

    /* compression stage */
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        if (cctx->cParamsChanged) {
            ZSTDMT_updateCParams_whileCompressing(cctx->mtctx, &cctx->requestedParams);
            cctx->cParamsChanged = 0;
        }
        {   size_t const flushMin = ZSTDMT_compressStream_generic(cctx->mtctx, output, input, endOp);
            if ( ZSTD_isError(flushMin)
              || (endOp == ZSTD_e_end && flushMin == 0) ) { /* compression completed */
                ZSTD_CCtx_reset(cctx);
            }
            return flushMin;
    }   }
#endif
    CHECK_F( ZSTD_compressStream_generic(cctx, output, input, endOp) );
    DEBUGLOG(5, "completed ZSTD_compress_generic");
    return cctx->outBuffContentSize - cctx->outBuffFlushedSize; /* remaining to flush */
}